

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snippet.cpp
# Opt level: O3

void __thiscall cpptrace::detail::snippet_manager::build_line_table(snippet_manager *this)

{
  vector<cpptrace::detail::line_range,_std::allocator<cpptrace::detail::line_range>_> *this_00;
  pointer *pplVar1;
  iterator iVar2;
  size_t sVar3;
  size_t sVar4;
  line_range local_48;
  
  this_00 = &this->line_table;
  local_48.begin = 0;
  local_48.end = 0;
  iVar2._M_current =
       (this->line_table).
       super__Vector_base<cpptrace::detail::line_range,_std::allocator<cpptrace::detail::line_range>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->line_table).
      super__Vector_base<cpptrace::detail::line_range,_std::allocator<cpptrace::detail::line_range>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<cpptrace::detail::line_range,_std::allocator<cpptrace::detail::line_range>_>::
    _M_realloc_insert<cpptrace::detail::line_range>(this_00,iVar2,&local_48);
  }
  else {
    (iVar2._M_current)->begin = 0;
    (iVar2._M_current)->end = 0;
    pplVar1 = &(this->line_table).
               super__Vector_base<cpptrace::detail::line_range,_std::allocator<cpptrace::detail::line_range>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *pplVar1 = *pplVar1 + 1;
  }
  sVar4 = 0;
  do {
    sVar3 = std::__cxx11::string::find((char)&this->contents,10);
    local_48.end = sVar3;
    local_48.begin = sVar4;
    if (sVar3 != 0) {
      if (sVar3 == 0xffffffffffffffff) {
        local_48.end = (this->contents)._M_string_length;
        iVar2._M_current =
             (this->line_table).
             super__Vector_base<cpptrace::detail::line_range,_std::allocator<cpptrace::detail::line_range>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (iVar2._M_current ==
            (this->line_table).
            super__Vector_base<cpptrace::detail::line_range,_std::allocator<cpptrace::detail::line_range>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<cpptrace::detail::line_range,_std::allocator<cpptrace::detail::line_range>_>::
          _M_realloc_insert<cpptrace::detail::line_range>(this_00,iVar2,&local_48);
        }
        else {
          (iVar2._M_current)->begin = sVar4;
          (iVar2._M_current)->end = local_48.end;
          pplVar1 = &(this->line_table).
                     super__Vector_base<cpptrace::detail::line_range,_std::allocator<cpptrace::detail::line_range>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *pplVar1 = *pplVar1 + 1;
        }
        return;
      }
      local_48.end = sVar3 - 1;
      if ((this->contents)._M_dataplus._M_p[sVar3 - 1] != '\r') {
        local_48.end = sVar3;
      }
    }
    iVar2._M_current =
         (this->line_table).
         super__Vector_base<cpptrace::detail::line_range,_std::allocator<cpptrace::detail::line_range>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (this->line_table).
        super__Vector_base<cpptrace::detail::line_range,_std::allocator<cpptrace::detail::line_range>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<cpptrace::detail::line_range,_std::allocator<cpptrace::detail::line_range>_>::
      _M_realloc_insert<cpptrace::detail::line_range>(this_00,iVar2,&local_48);
    }
    else {
      (iVar2._M_current)->begin = sVar4;
      (iVar2._M_current)->end = local_48.end;
      pplVar1 = &(this->line_table).
                 super__Vector_base<cpptrace::detail::line_range,_std::allocator<cpptrace::detail::line_range>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *pplVar1 = *pplVar1 + 1;
    }
    sVar4 = sVar3 + 1;
  } while( true );
}

Assistant:

void build_line_table() {
            line_table.push_back({0, 0});
            std::size_t pos = 0; // stores the start of the current line
            while(true) {
                // find the end of the current line
                std::size_t terminator_pos = contents.find('\n', pos);
                if(terminator_pos == std::string::npos) {
                    line_table.push_back({pos, contents.size()});
                    break;
                } else {
                    std::size_t end_pos = terminator_pos; // one past the end of the current line
                    if(end_pos > 0 && contents[end_pos - 1] == '\r') {
                        end_pos--;
                    }
                    line_table.push_back({pos, end_pos});
                    pos = terminator_pos + 1;
                }
            }
        }